

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O1

int main(void)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  thread_data *__arg;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *local_38;
  void *ret;
  
  plan(5);
  _space((FILE *)_stdout);
  lVar4 = 0;
  printf("# *** %s ***\n","main");
  quota.value = 0;
  uVar2 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar2 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar2);
  __arg = datum;
  do {
    pthread_create((pthread_t *)((long)threads + lVar4),(pthread_attr_t *)0x0,thread_routine,__arg);
    lVar4 = lVar4 + 8;
    __arg = __arg + 1;
  } while (lVar4 != 0x50);
  lVar4 = 0;
  lVar8 = 0;
  do {
    iVar1 = pthread_join(*(pthread_t *)((long)threads + lVar4),&local_38);
    lVar8 = lVar8 + iVar1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x50);
  lVar4 = 0x18;
  lVar5 = 0;
  lVar7 = 0;
  lVar6 = 0;
  bVar3 = 0;
  do {
    if (*(long *)((long)threads + lVar4 + 0x40) == (quota.value >> 0x20) << 10) {
      bVar3 = 1;
    }
    lVar6 = lVar6 + *(long *)((long)threads + lVar4 + 0x38);
    lVar5 = lVar5 + *(long *)((long)threads + lVar4 + 0x48);
    lVar7 = lVar7 + *(long *)((long)&datum[0].use_change + lVar4);
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x158);
  _ok((uint)(lVar8 == 0),"check_fail_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x5e,
      "no fails detected");
  _ok((uint)bVar3,"one_set_successed",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x5f,
      "one of thread limit set is final");
  _ok((uint)(lVar6 == (quota.value & 0xffffffff) * 0x400),"total_alloc == quota_used(&quota)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x60,
      "total alloc match");
  _ok((uint)(0x20000 < lVar5),"use_success_count > THREAD_CNT * RUN_CNT * .1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x61,
      "uses are mosly successful");
  _ok((uint)(0x20000 < lVar7),"set_success_count > THREAD_CNT * RUN_CNT * .1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x62,
      "sets are mosly successful");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(5);
	header();

	quota_init(&quota, 0);
	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	for (size_t i = 0; i < THREAD_CNT; i++) {
		pthread_create(threads + i, 0, thread_routine, (void *)(datum + i));
	}

	size_t check_fail_count = 0;
	for (size_t i = 0; i < THREAD_CNT; i++) {
		void *ret;
		check_fail_count += (size_t)pthread_join(threads[i], &ret);
	}

	bool one_set_successed = false;
	size_t total_alloc = 0;
	long set_success_count = 0;
	long use_success_count = 0;
	for (size_t i = 0; i < THREAD_CNT; i++) {
		if (datum[i].last_lim_set == quota_total(&quota))
			one_set_successed = true;
		total_alloc += datum[i].use_change;
		use_success_count += datum[i].use_change_success;
		set_success_count += datum[i].lim_change_success;
	}

	ok(check_fail_count == 0, "no fails detected");
	ok(one_set_successed, "one of thread limit set is final");
	ok(total_alloc == quota_used(&quota), "total alloc match");
	ok(use_success_count > THREAD_CNT * RUN_CNT * .1, "uses are mosly successful");
	ok(set_success_count > THREAD_CNT * RUN_CNT * .1, "sets are mosly successful");

	footer();
	return check_plan();
}